

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormat::toLocalizedPattern(DecimalFormat *this,UnicodeString *result)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  DecimalFormatSymbols *symbols;
  UErrorCode *status;
  UnicodeString local_78;
  undefined1 local_28 [8];
  ErrorCode localStatus;
  UnicodeString *result_local;
  DecimalFormat *this_local;
  
  localStatus._8_8_ = result;
  ErrorCode::ErrorCode((ErrorCode *)local_28);
  iVar2 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x4d])
                    (this,localStatus._8_8_);
  UnicodeString::operator=
            ((UnicodeString *)localStatus._8_8_,(UnicodeString *)CONCAT44(extraout_var,iVar2));
  uVar1 = localStatus._8_8_;
  symbols = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator*
                      (&(this->fields->symbols).
                        super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
  status = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_28);
  icu_63::number::impl::PatternStringUtils::convertLocalized
            (&local_78,(UnicodeString *)uVar1,symbols,true,status);
  UnicodeString::operator=((UnicodeString *)localStatus._8_8_,&local_78);
  UnicodeString::~UnicodeString(&local_78);
  uVar1 = localStatus._8_8_;
  ErrorCode::~ErrorCode((ErrorCode *)local_28);
  return (UnicodeString *)uVar1;
}

Assistant:

UnicodeString& DecimalFormat::toLocalizedPattern(UnicodeString& result) const {
    ErrorCode localStatus;
    result = toPattern(result);
    result = PatternStringUtils::convertLocalized(result, *fields->symbols, true, localStatus);
    return result;
}